

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  SnapEntry *pSVar1;
  uint uVar2;
  uint uVar3;
  GCtrace *pGVar4;
  SnapShot *pSVar5;
  lua_State *L_00;
  TValue *t_00;
  TValue *pTVar6;
  TValue *pTVar7;
  long in_RDI;
  GCtab *t;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  SnapNo sn;
  GCtrace *T;
  TValue *local_98;
  undefined8 in_stack_ffffffffffffff70;
  lua_State *in_stack_ffffffffffffff78;
  int32_t iVar8;
  GCtab *in_stack_ffffffffffffff80;
  lua_State *in_stack_ffffffffffffff88;
  uint local_6c;
  int local_40;
  
  pGVar4 = jit_checktrace(in_stack_ffffffffffffff78);
  uVar2 = lj_lib_checkint(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20))
  ;
  iVar8 = (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if ((pGVar4 == (GCtrace *)0x0) || (pGVar4->nsnap <= uVar2)) {
    local_40 = 0;
  }
  else {
    pSVar5 = pGVar4->snap + uVar2;
    pSVar1 = pGVar4->snapmap;
    uVar2 = pSVar5->mapofs;
    uVar3 = (uint)pSVar5->nent;
    lua_createtable(in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                    (int)in_stack_ffffffffffffff80);
    L_00 = (lua_State *)(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8);
    if (*(int *)&L_00->top == 0) {
      t_00 = lj_tab_setinth(L_00,in_stack_ffffffffffffff80,iVar8);
    }
    else {
      t_00 = (TValue *)(ulong)(L_00->glref).ptr32;
    }
    t_00->n = (double)(int)(pSVar5->ref - 0x8000);
    if (*(uint *)&L_00->top < 2) {
      pTVar6 = lj_tab_setinth(L_00,(GCtab *)&t_00->field_2,iVar8);
    }
    else {
      pTVar6 = (TValue *)((ulong)(L_00->glref).ptr32 + 8);
    }
    pTVar6->n = (double)pSVar5->nslots;
    for (local_6c = 0; iVar8 = (int32_t)((ulong)pTVar6 >> 0x20), local_6c < uVar3;
        local_6c = local_6c + 1) {
      if (local_6c + 2 < *(uint *)&L_00->top) {
        pTVar7 = (TValue *)((ulong)(L_00->glref).ptr32 + (long)(int)(local_6c + 2) * 8);
      }
      else {
        pTVar7 = lj_tab_setinth(L_00,(GCtab *)&t_00->field_2,iVar8);
      }
      pTVar7->n = (double)(int)pSVar1[(ulong)uVar2 + (ulong)local_6c];
    }
    if (uVar3 + 2 < *(uint *)&L_00->top) {
      local_98 = (TValue *)((ulong)(L_00->glref).ptr32 + (long)(int)(uVar3 + 2) * 8);
    }
    else {
      local_98 = lj_tab_setinth(L_00,(GCtab *)&t_00->field_2,iVar8);
    }
    local_98->u64 = 0xc170000000000000;
    local_40 = 1;
  }
  return local_40;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}